

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_QByteArray>,_char>,_QByteArray>::
convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_QByteArray>,_char>,_QByteArray>
          *this)

{
  char *__dest;
  size_t sVar1;
  qsizetype n;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = (char *)((this->b).d.size + (this->a).a.a.m_size + (this->a).a.b.d.size + 1);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(longlong)pcVar3,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  sVar1 = (this->a).a.a.m_size;
  if (sVar1 != 0) {
    memcpy(__dest,(this->a).a.a.m_data,sVar1);
  }
  pcVar2 = __dest + sVar1;
  sVar1 = (this->a).a.b.d.size;
  if (sVar1 != 0) {
    memcpy(pcVar2,(this->a).a.b.d.ptr,sVar1);
  }
  pcVar2 = pcVar2 + sVar1;
  *pcVar2 = (this->a).b;
  sVar1 = (this->b).d.size;
  if (sVar1 != 0) {
    memcpy(pcVar2 + 1,(this->b).d.ptr,sVar1);
  }
  if (pcVar3 != pcVar2 + 1 + (sVar1 - (long)__dest)) {
    QByteArray::resize((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }